

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Int_t * Lms_GiaFindNonRedundantCos(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  word D1;
  word D2;
  Vec_Int_t *p_02;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_48;
  
  p_00 = Lms_GiaDelays(p->pGia);
  p_01 = Lms_GiaCollectUsefulCos(p);
  iVar3 = p_01->nSize;
  iVar4 = 0;
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  local_48 = 1;
  do {
    if (iVar4 == iVar5) {
      p_02 = Vec_IntAlloc(1000);
      for (iVar3 = 0; iVar5 != iVar3; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(p_01,iVar3);
        if (-1 < iVar4) {
          Vec_IntPush(p_02,iVar4);
        }
      }
      Vec_IntFree(p_01);
      Vec_WrdFree(p_00);
      return p_02;
    }
    iVar1 = Vec_IntEntry(p_01,iVar4);
    if (-1 < iVar1) {
      D1 = Vec_WrdEntry(p_00,iVar1);
      iVar1 = local_48;
      if (D1 == 0) {
        __assert_fail("D1 > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                      ,0x4de,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
      }
      for (; iVar1 < iVar3; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(p_01,iVar1);
        if (iVar2 != -2) {
          if (iVar2 == -1) break;
          D2 = Vec_WrdEntry(p_00,iVar2);
          if (D2 == 0) {
            __assert_fail("D2 > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                          ,0x4e6,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
          }
          iVar2 = Lms_DelayDom(D1,D2,p->pGia->vCis->nSize);
          if (iVar2 == 0) {
            iVar2 = Lms_DelayDom(D2,D1,p->pGia->vCis->nSize);
            if (iVar2 != 0) {
              Vec_IntWriteEntry(p_01,iVar4,-2);
              break;
            }
          }
          else {
            Vec_IntWriteEntry(p_01,iVar1,-2);
          }
        }
      }
    }
    iVar4 = iVar4 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Lms_GiaFindNonRedundantCos( Lms_Man_t * p )
{
    Vec_Int_t * vRemain;
    Vec_Int_t * vUseful;
    Vec_Wrd_t * vDelays;
    int i, k, EntryI, EntryK;
    word D1, D2;
    vDelays = Lms_GiaDelays( p->pGia );
    vUseful = Lms_GiaCollectUsefulCos( p );
    Vec_IntForEachEntry( vUseful, EntryI, i )
    {
        if ( EntryI < 0 )
            continue;
        D1 = Vec_WrdEntry(vDelays, EntryI);
        assert( D1 > 0 );
        Vec_IntForEachEntryStart( vUseful, EntryK, k, i+1 )
        {
            if ( EntryK == -1 )
                break;
            if ( EntryK == -2 )
                continue;
            D2 = Vec_WrdEntry(vDelays, EntryK);
            assert( D2 > 0 );
            if ( Lms_DelayDom(D1, D2, Gia_ManCiNum(p->pGia)) ) // D1 dominate D2
            {
                Vec_IntWriteEntry( vUseful, k, -2 );
                continue;
            }
            if ( Lms_DelayDom(D2, D1, Gia_ManCiNum(p->pGia)) ) // D2 dominate D1
            {
                Vec_IntWriteEntry( vUseful, i, -2 );
                break;
            }
        }
    }

    vRemain = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vUseful, EntryI, i )
        if ( EntryI >= 0 )
            Vec_IntPush( vRemain, EntryI );
    Vec_IntFree( vUseful );
    Vec_WrdFree( vDelays );
    return vRemain;
}